

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O0

bool __thiscall pg::TLQSolver::attracts(TLQSolver *this,int pl,int v,bitset *Z,bitset *R)

{
  bool bVar1;
  int iVar2;
  undefined1 local_80 [16];
  undefined1 local_70 [28];
  int to;
  int *curedge_1;
  undefined1 local_48 [7];
  bool hasZ;
  int *local_38;
  int *curedge;
  bitset *R_local;
  bitset *Z_local;
  int v_local;
  int pl_local;
  TLQSolver *this_local;
  
  curedge = (int *)R;
  R_local = Z;
  Z_local._0_4_ = v;
  Z_local._4_4_ = pl;
  _v_local = this;
  iVar2 = Solver::owner(&this->super_Solver,v);
  if (iVar2 == Z_local._4_4_) {
    for (local_38 = Solver::outs(&this->super_Solver,(int)Z_local); *local_38 != -1;
        local_38 = local_38 + 1) {
      bitset::operator[]((bitset *)local_48,(size_t)R_local);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_48);
      if (bVar1) {
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  else {
    curedge_1._7_1_ = 0;
    for (register0x00000000 = Solver::outs(&this->super_Solver,(int)Z_local);
        *stack0xffffffffffffffa8 != -1; register0x00000000 = stack0xffffffffffffffa8 + 1) {
      local_70._20_4_ = *stack0xffffffffffffffa8;
      bitset::operator[]((bitset *)local_70,(size_t)R_local);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_70);
      if (bVar1) {
        curedge_1._7_1_ = 1;
      }
      else {
        bitset::operator[]((bitset *)local_80,(size_t)curedge);
        bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_80);
        if (bVar1) {
          return false;
        }
      }
    }
    this_local._7_1_ = (bool)(curedge_1._7_1_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool
TLQSolver::attracts(const int pl, const int v, bitset &Z, bitset &R)
{
    if (owner(v) == pl) {
        for (auto curedge = outs(v); *curedge != -1; curedge++) {
            if (Z[*curedge]) return true;
        }
        return false;
    } else {
        bool hasZ = false;
        for (auto curedge = outs(v); *curedge != -1; curedge++) {
            int to = *curedge;
            if (Z[to]) { hasZ = true; continue; }
            if (R[to]) return false;
        }
        return hasZ;
    }
}